

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O1

void __thiscall QColumnViewPrivate::QColumnViewPrivate(QColumnViewPrivate *this)

{
  QAbstractItemViewPrivate::QAbstractItemViewPrivate(&this->super_QAbstractItemViewPrivate);
  *(undefined ***)
   &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.super_QFramePrivate.
    super_QWidgetPrivate = &PTR__QColumnViewPrivate_0081ae60;
  (this->columns).d.d = (Data *)0x0;
  (this->columns).d.ptr = (QAbstractItemView **)0x0;
  (this->columns).d.size = 0;
  (this->columnSizes).d.d = (Data *)0x0;
  (this->columnSizes).d.ptr = (int *)0x0;
  (this->columnSizes).d.size = 0;
  this->showResizeGrips = true;
  this->offset = 0;
  QPropertyAnimation::QPropertyAnimation(&this->currentAnimation,(QObject *)0x0);
  QMetaObject::Connection::Connection(&this->animationConnection);
  this->previewWidget = (QWidget *)0x0;
  this->previewColumn = (QAbstractItemView *)0x0;
  (this->gripConnections).
  super__Vector_base<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->viewConnections).d = (Data *)0x0;
  (this->gripConnections).
  super__Vector_base<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->gripConnections).
  super__Vector_base<QMetaObject::Connection,_std::allocator<QMetaObject::Connection>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

QColumnViewPrivate::QColumnViewPrivate()
:  QAbstractItemViewPrivate()
,showResizeGrips(true)
,offset(0)
,previewWidget(nullptr)
,previewColumn(nullptr)
{
}